

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20>::Resize
          (TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20> *this,int64_t newsize
          )

{
  ulong uVar1;
  TPZReference *pTVar2;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar3;
  ulong *puVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar10;
  double dVar11;
  
  if (-1 < newsize) {
    lVar8 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements;
    if (lVar8 != newsize) {
      lVar9 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc;
      if (lVar9 < newsize) {
        if ((ulong)newsize < 0x15) {
          pTVar10 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore;
          pTVar3 = this->fExtAlloc;
          if (pTVar10 != pTVar3) {
            if (0 < lVar8) {
              lVar9 = 0;
              lVar8 = 0;
              do {
                TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                          ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                           ((long)&pTVar3->fRef + lVar9),
                           (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                           ((long)&((this->
                                    super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>
                                    ).fStore)->fRef + lVar9));
                lVar8 = lVar8 + 1;
                lVar9 = lVar9 + 8;
              } while (lVar8 < (this->
                               super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                               fNElements);
              pTVar10 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                        fStore;
            }
            if (pTVar10 != (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0) {
              pTVar2 = pTVar10[-1].fRef;
              if (pTVar2 != (TPZReference *)0x0) {
                lVar8 = (long)pTVar2 * 8;
                do {
                  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer
                            ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                             ((long)&pTVar10[-1].fRef + lVar8));
                  lVar8 = lVar8 + -8;
                } while (lVar8 != 0);
              }
              operator_delete__(pTVar10 + -1,(long)pTVar2 * 8 + 8);
            }
            (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore = pTVar3
            ;
          }
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements =
               newsize;
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc = 0;
        }
        else {
          dVar11 = (double)lVar9 * 1.2;
          uVar7 = (long)dVar11;
          if (dVar11 < (double)newsize) {
            uVar7 = newsize;
          }
          uVar1 = uVar7 * 8;
          uVar6 = 0xffffffffffffffff;
          if (uVar1 < 0xfffffffffffffff8) {
            uVar6 = uVar1 + 8;
          }
          puVar4 = (ulong *)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar6);
          *puVar4 = uVar7;
          if (uVar7 != 0) {
            lVar9 = 0;
            do {
              puVar5 = (undefined8 *)operator_new(0x10);
              *(undefined4 *)(puVar5 + 1) = 0;
              *puVar5 = 0;
              LOCK();
              *(undefined4 *)(puVar5 + 1) = 1;
              UNLOCK();
              *(undefined8 **)((long)puVar4 + lVar9 + 8) = puVar5;
              lVar9 = lVar9 + 8;
            } while (uVar1 - lVar9 != 0);
          }
          if (0 < lVar8) {
            lVar8 = 0;
            lVar9 = 0;
            do {
              TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                        ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                         ((long)&((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)(puVar4 + 1))
                                 ->fRef + lVar8),
                         (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                         ((long)&((this->
                                  super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                                 fStore)->fRef + lVar8));
              lVar9 = lVar9 + 1;
              lVar8 = lVar8 + 8;
            } while (lVar9 < (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>
                             ).fNElements);
          }
          pTVar3 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore;
          if (pTVar3 != (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0 &&
              pTVar3 != this->fExtAlloc) {
            pTVar2 = pTVar3[-1].fRef;
            if (pTVar2 != (TPZReference *)0x0) {
              lVar8 = (long)pTVar2 * 8;
              do {
                TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer
                          ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                           ((long)&pTVar3[-1].fRef + lVar8));
                lVar8 = lVar8 + -8;
              } while (lVar8 != 0);
            }
            operator_delete__(pTVar3 + -1,(long)pTVar2 * 8 + 8);
          }
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore =
               (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)(puVar4 + 1);
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements =
               newsize;
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc = uVar7;
        }
      }
      else {
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements =
             newsize;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}